

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O0

RC __thiscall PF_BufferMgr::LinkHead(PF_BufferMgr *this,int slot)

{
  int slot_local;
  PF_BufferMgr *this_local;
  
  this->bufTable[slot].next = this->first;
  this->bufTable[slot].prev = -1;
  if (this->first != -1) {
    this->bufTable[this->first].prev = slot;
  }
  this->first = slot;
  if (this->last == -1) {
    this->last = this->first;
  }
  return 0;
}

Assistant:

RC PF_BufferMgr::LinkHead(int slot)
{
   // Set next and prev pointers of slot entry
   bufTable[slot].next = first;
   bufTable[slot].prev = INVALID_SLOT;

   // If list isn't empty, point old first back to slot
   if (first != INVALID_SLOT)
      bufTable[first].prev = slot;

   first = slot;

   // if list was empty, set last to slot
   if (last == INVALID_SLOT)
      last = first;

   // Return ok
   return (0);
}